

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_dsp.c
# Opt level: O3

void SharpYuvInitDsp(void)

{
  int iVar1;
  
  SharpYuvUpdateY = SharpYuvUpdateY_C;
  SharpYuvUpdateRGB = SharpYuvUpdateRGB_C;
  SharpYuvFilterRow = SharpYuvFilterRow_C;
  if (SharpYuvGetCPUInfo != (VP8CPUInfo)0x0) {
    iVar1 = (*SharpYuvGetCPUInfo)(kSSE2);
    if (iVar1 != 0) {
      SharpYuvUpdateY = SharpYuvUpdateY_SSE2;
      SharpYuvUpdateRGB = SharpYuvUpdateRGB_SSE2;
      SharpYuvFilterRow = SharpYuvFilterRow_SSE2;
      return;
    }
  }
  return;
}

Assistant:

void SharpYuvInitDsp(void) {
#if !WEBP_NEON_OMIT_C_CODE
  SharpYuvUpdateY = SharpYuvUpdateY_C;
  SharpYuvUpdateRGB = SharpYuvUpdateRGB_C;
  SharpYuvFilterRow = SharpYuvFilterRow_C;
#endif

  if (SharpYuvGetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (SharpYuvGetCPUInfo(kSSE2)) {
      InitSharpYuvSSE2();
    }
#endif  // WEBP_HAVE_SSE2
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (SharpYuvGetCPUInfo != NULL && SharpYuvGetCPUInfo(kNEON))) {
    InitSharpYuvNEON();
  }
#endif  // WEBP_HAVE_NEON

  assert(SharpYuvUpdateY != NULL);
  assert(SharpYuvUpdateRGB != NULL);
  assert(SharpYuvFilterRow != NULL);
}